

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainingTests.cpp
# Opt level: O0

void __thiscall
IsStringContainingSubstringTests::~IsStringContainingSubstringTests
          (IsStringContainingSubstringTests *this)

{
  IsStringContainingSubstringTests *this_local;
  
  ~IsStringContainingSubstringTests(this);
  operator_delete(this);
  return;
}

Assistant:

virtual void Run()
	{
		Then("string containing desired string is true", [&]() {
			AssertThat(ut11::Is::String::Containing("Hell")("AvsdaHelloasdagf"), ut11::Is::True);
		});

		Then("string not containing desired string is false", [&]() {
			AssertThat(ut11::Is::String::Containing("World")("AvsdaHelloasdagf"), ut11::Is::False);
		});

		Then("Is::String::Containing is an operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::String::Containing("world")) >::value, ut11::Is::True);
		});

		Then("Is::String::Containing has an error message", []() {
			AssertThat(ut11::Is::String::Containing("world").GetErrorMessage("piano"), ut11::Is::Not::EqualTo(""));
		});
	}